

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetBufferModeString(BUFFER_MODE Mode)

{
  int iVar1;
  Char *pCVar2;
  BUFFER_MODE Mode_local;
  
  if (GetBufferModeString(Diligent::BUFFER_MODE)::BuffModeToStr == '\0') {
    iVar1 = __cxa_guard_acquire(&GetBufferModeString(Diligent::BUFFER_MODE)::BuffModeToStr);
    if (iVar1 != 0) {
      GetBufferModeString::BufferModeToStringMap::BufferModeToStringMap
                (&GetBufferModeString::BuffModeToStr);
      __cxa_guard_release(&GetBufferModeString(Diligent::BUFFER_MODE)::BuffModeToStr);
    }
  }
  pCVar2 = GetBufferModeString(Diligent::BUFFER_MODE)::BufferModeToStringMap::operator[](Diligent::
           BUFFER_MODE__const(&GetBufferModeString::BuffModeToStr,Mode);
  return pCVar2;
}

Assistant:

const Char* GetBufferModeString(BUFFER_MODE Mode)
{
    struct BufferModeToStringMap
    {
        BufferModeToStringMap()
        {
#define INIT_BUFF_MODE_STR(Mode) BufferModeStrings[Mode] = #Mode
            INIT_BUFF_MODE_STR(BUFFER_MODE_UNDEFINED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_FORMATTED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_STRUCTURED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_RAW);
#undef INIT_BUFF_MODE_STR
            static_assert(BUFFER_MODE_NUM_MODES == 4, "Not all buffer mode strings initialized.");
        }

        const Char* operator[](BUFFER_MODE Mode) const
        {
            if (Mode >= BUFFER_MODE_UNDEFINED && Mode < BUFFER_MODE_NUM_MODES)
                return BufferModeStrings[Mode];
            else
            {
                UNEXPECTED("Unknown buffer mode");
                return "Unknown buffer mode";
            }
        }

    private:
        std::array<const Char*, BUFFER_MODE_NUM_MODES> BufferModeStrings{};
    };

    static const BufferModeToStringMap BuffModeToStr;
    return BuffModeToStr[Mode];
}